

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O0

bool __thiscall gpu::Device::supportsFreeMemoryQuery(Device *this)

{
  bool bVar1;
  allocator local_161;
  string local_160;
  undefined1 local_130 [8];
  DeviceInfo device_info;
  Device *this_local;
  
  if ((this->supports_opencl & 1U) != 0) {
    device_info.extensions._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
    ocl::DeviceInfo::DeviceInfo((DeviceInfo *)local_130);
    ocl::DeviceInfo::init((DeviceInfo *)local_130,(EVP_PKEY_CTX *)this->device_id_opencl);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_160,"cl_amd_device_attribute_query",&local_161);
    bVar1 = ocl::DeviceInfo::hasExtension((DeviceInfo *)local_130,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    if (bVar1) {
      this_local._7_1_ = 1;
    }
    ocl::DeviceInfo::~DeviceInfo((DeviceInfo *)local_130);
    if (bVar1) goto LAB_00169cad;
  }
  this_local._7_1_ = 0;
LAB_00169cad:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Device::supportsFreeMemoryQuery() const
{
#ifdef CUDA_SUPPORT
	if (supports_cuda) {
		return true;
	} else
#endif
	if (supports_opencl) {
		ocl::DeviceInfo device_info;
		device_info.init(device_id_opencl);
		if (device_info.hasExtension(CL_AMD_DEVICE_ATTRIBUTE_QUERY_EXT)) {
			return true;
		}
	}

	return false;
}